

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::StringUtilTest_HexEncode_Test::TestBody(StringUtilTest_HexEncode_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t in_RCX;
  unsigned_long *lhs;
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  uchar *local_b0;
  string local_a8;
  uchar local_88 [8];
  uint8_t bytes [7];
  Message local_78 [3];
  uint local_5c;
  unsigned_long local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  uchar *local_38;
  undefined1 local_30 [8];
  string hex;
  StringUtilTest_HexEncode_Test *this_local;
  
  hex.field_2._8_8_ = this;
  Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&gtest_ar.message_);
  data.size_ = in_RCX;
  data.data_ = local_38;
  string_util::HexEncode_abi_cxx11_
            ((string *)local_30,
             (string_util *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,data);
  local_58 = ::std::__cxx11::string::length();
  local_5c = 0;
  lhs = &local_58;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_50,"hex.length()","0U",lhs,&local_5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    lhs = (unsigned_long *)0x71;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)bytes,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)bytes);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_88[4] = '\x03';
  local_88[5] = 0x80;
  local_88[6] = 0x81;
  local_88[0] = '\x01';
  local_88[1] = 0xff;
  local_88[2] = '\x02';
  local_88[3] = 0xfe;
  Span<unsigned_char_const>::Span<7ul>
            ((Span<unsigned_char_const> *)&gtest_ar_1.message_,(uchar (*) [7])local_88);
  data_00.size_ = (size_t)lhs;
  data_00.data_ = local_b0;
  string_util::HexEncode_abi_cxx11_
            (&local_a8,
             (string_util *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,data_00);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[15],_nullptr>
            ((EqHelper *)local_c8,"hex","\"01FF02FE038081\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [15])"01FF02FE038081");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(StringUtilTest, HexEncode) {
  std::string hex(bssl::string_util::HexEncode({}));
  EXPECT_EQ(hex.length(), 0U);
  uint8_t bytes[] = {0x01, 0xff, 0x02, 0xfe, 0x03, 0x80, 0x81};
  hex = bssl::string_util::HexEncode(bytes);
  EXPECT_EQ(hex, "01FF02FE038081");
}